

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O1

tb_page_addr_t
get_page_addr_code_hostp_arm(CPUArchState_conflict *env,target_ulong_conflict addr,void **hostp)

{
  uint uVar1;
  uc_struct_conflict1 *puVar2;
  TargetPageBits *pTVar3;
  _Bool _Var4;
  uintptr_t size_mask;
  tb_page_addr_t tVar5;
  long lVar6;
  long lVar7;
  ulong index;
  void *ptr;
  uint page;
  uc_struct_conflict1 *uc;
  uint mmu_idx;
  long lVar8;
  CPUARMState *__mptr;
  ulong uVar9;
  
  puVar2 = env->uc;
  mmu_idx = *(byte *)((long)&env->hflags + 3) & 0xf;
  uVar9 = (ulong)(mmu_idx << 4);
  lVar6 = *(long *)((long)env + (uVar9 - 200));
  pTVar3 = puVar2->init_target_page;
  index = (ulong)((uint)(*(ulong *)((long)env + (uVar9 - 0xd0)) >> 6) &
                 addr >> ((byte)pTVar3->bits & 0x1f));
  lVar7 = index * 0x40;
  lVar8 = lVar6 + lVar7;
  uVar1 = pTVar3->mask;
  page = uVar1 & addr;
  if (((uVar1 | 0x200) & *(uint *)(lVar6 + 8 + lVar7)) != page) {
    _Var4 = victim_tlb_hit(env,(ulong)mmu_idx,index,8,page);
    if (!_Var4) {
      tlb_fill((CPUState *)(env[-10].cp15.c14_pmevcntr + 0x1b),addr,0,MMU_INST_FETCH,mmu_idx,0);
      lVar8 = *(long *)((long)env + (uVar9 - 200));
      lVar6 = (ulong)((uint)(*(ulong *)((long)env + (uVar9 - 0xd0)) >> 6) &
                     addr >> ((byte)env->uc->init_target_page->bits & 0x1f)) * 0x40;
      if ((*(byte *)(lVar8 + 9 + lVar6) & 2) != 0) {
        return 0xffffffffffffffff;
      }
      lVar8 = lVar8 + lVar6;
    }
    uVar1 = puVar2->init_target_page->mask;
    if (((uVar1 | 0x200) & *(uint *)(lVar8 + 8)) != (uVar1 & addr)) {
      __assert_fail("tlb_hit(uc, entry->addr_code, addr)",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cputlb.c"
                    ,0x463,
                    "tb_page_addr_t get_page_addr_code_hostp_arm(CPUArchState *, target_ulong, void **)"
                   );
    }
  }
  if ((*(byte *)(lVar8 + 8) & 0x80) == 0) {
    ptr = (void *)((ulong)addr + *(long *)(lVar8 + 0x10));
    if (hostp != (void **)0x0) {
      *hostp = ptr;
    }
    tVar5 = qemu_ram_addr_from_host_arm(env->uc,ptr);
    if (tVar5 == 0xffffffffffffffff) {
      abort();
    }
  }
  else {
    tVar5 = 0xffffffffffffffff;
    if (hostp != (void **)0x0) {
      *hostp = (void *)0x0;
    }
  }
  return tVar5;
}

Assistant:

tb_page_addr_t get_page_addr_code_hostp(CPUArchState *env, target_ulong addr,
                                        void **hostp)
{
    struct uc_struct *uc = env->uc;
    uintptr_t mmu_idx = cpu_mmu_index(env, true);
    uintptr_t index = tlb_index(env, mmu_idx, addr);
    CPUTLBEntry *entry = tlb_entry(env, mmu_idx, addr);
    void *p;

    if (unlikely(!tlb_hit(uc, entry->addr_code, addr))) {
        if (!VICTIM_TLB_HIT(addr_code, addr)) {
            tlb_fill(env_cpu(env), addr, 0, MMU_INST_FETCH, mmu_idx, 0);
            index = tlb_index(env, mmu_idx, addr);
            entry = tlb_entry(env, mmu_idx, addr);

            if (unlikely(entry->addr_code & TLB_INVALID_MASK)) {
                /*
                 * The MMU protection covers a smaller range than a target
                 * page, so we must redo the MMU check for every insn.
                 */
                return -1;
            }
        }
        assert(tlb_hit(uc, entry->addr_code, addr));
    }

    if (unlikely(entry->addr_code & TLB_MMIO)) {
        /* The region is not backed by RAM.  */
        if (hostp) {
            *hostp = NULL;
        }
        return -1;
    }

    p = (void *)((uintptr_t)addr + entry->addend);
    if (hostp) {
        *hostp = p;
    }
    return qemu_ram_addr_from_host_nofail(env->uc, p);
}